

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall polyscope::render::Engine::setSSAAFactor(Engine *this,int newVal)

{
  runtime_error *this_00;
  int in_ESI;
  long *in_RDI;
  
  if ((0 < in_ESI) && (in_ESI < 5)) {
    *(int *)((long)in_RDI + 0x224) = in_ESI;
    (**(code **)(*in_RDI + 0x88))(in_RDI,1);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"ssaaFactor must be one of 1,2,3,4");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Engine::setSSAAFactor(int newVal) {
  if (newVal < 1 || newVal > 4) throw std::runtime_error("ssaaFactor must be one of 1,2,3,4");
  ssaaFactor = newVal;
  updateWindowSize(true);
}